

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_2,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ShaderEvalContext *evalCtx_00;
  ShaderEvalContext *extraout_RDX;
  Type in1;
  Vector<float,_2> local_78;
  Mat4x2 local_70;
  Vector<float,_3> local_50;
  tcu local_40 [8];
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  evalCtx_00 = (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              (&local_78,(Vector<float,_2> *)sr::(anonymous_namespace)::s_constInVec2);
    evalCtx_00 = extraout_RDX;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,11>
              (&local_70,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix
              (&local_70,(float *)(sr::(anonymous_namespace)::s_constInMat4x2 + 0x20));
  }
  tcu::operator*(local_40,&local_78,&local_70);
  local_50.m_data[2] = local_38 + local_34;
  local_50.m_data._0_8_ = local_40;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_50);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}